

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.hpp
# Opt level: O0

void __thiscall
pstore::command_line::help<std::basic_ostream<char,_std::char_traits<char>_>_>::show
          (help<std::basic_ostream<char,_std::char_traits<char>_>_> *this)

{
  anon_class_40_5_f37d82ab __f;
  bool bVar1;
  int __n;
  size_t sVar2;
  czstring pcVar3;
  ostream *poVar4;
  string *psVar5;
  options_container *all;
  const_iterator *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  size_t sVar7;
  unsigned_long *puVar8;
  options_set *extraout_RDX;
  options_set *extraout_RDX_00;
  options_set *ops;
  anon_class_40_5_f37d82ab local_210;
  long local_1e8;
  long lStack_1e0;
  help<std::basic_ostream<char,_std::char_traits<char>_>_> *local_1d8;
  size_t *psStack_1d0;
  size_t *local_1c8;
  word_wrapper local_1c0;
  word_wrapper local_188;
  string *local_150;
  string *description;
  value_type *local_140;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *name;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
  *__range4;
  bool is_overlong;
  option *poStack_118;
  bool is_first;
  option *op;
  pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>
  *sw;
  iterator __end0_1;
  iterator __begin0_1;
  switch_strings *__range3;
  string local_b8 [32];
  reference local_98;
  pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>
  *cat;
  const_iterator __end0;
  const_iterator __begin0;
  categories_collection *__range2;
  size_t description_width;
  size_t indent;
  size_t local_58;
  size_t max_name_len;
  categories_collection categories;
  czstring new_line;
  size_t max_width;
  help<std::basic_ostream<char,_std::char_traits<char>_>_> *this_local;
  
  sVar2 = details::get_max_width();
  categories._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)stream_trait<char>::out_text("\n");
  poVar4 = this->outs_;
  pcVar3 = stream_trait<char>::out_text("OVERVIEW: ");
  poVar4 = std::operator<<(poVar4,pcVar3);
  psVar5 = stream_trait<char>::out_string(&this->overview_);
  poVar4 = std::operator<<(poVar4,(string *)psVar5);
  std::operator<<(poVar4,"\n");
  usage(this);
  all = option::all_abi_cxx11_();
  details::build_categories((categories_collection *)&max_name_len,&this->super_option,all);
  local_58 = details::widest_option((categories_collection *)&max_name_len);
  description_width = local_58 + 3;
  sVar2 = (sVar2 - local_58) - 5;
  __end0 = std::
           map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
           ::begin((map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
                    *)&max_name_len);
  cat = (pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>
         *)std::
           map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
           ::end((map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
                  *)&max_name_len);
  do {
    bVar1 = std::operator!=(&__end0,(_Self *)&cat);
    if (!bVar1) {
      std::
      map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
      ::~map((map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
              *)&max_name_len);
      return;
    }
    local_98 = std::
               _Rb_tree_const_iterator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>
               ::operator*(&__end0);
    poVar4 = std::operator<<(this->outs_,"\n");
    __range3._6_1_ = 0;
    if (local_98->first == (option_category *)0x0) {
      std::allocator<char>::allocator();
      __range3._6_1_ = 1;
      std::__cxx11::string::string(local_b8,"OPTIONS",(allocator *)((long)&__range3 + 7));
    }
    else {
      psVar5 = option_category::title_abi_cxx11_(local_98->first);
      std::__cxx11::string::string(local_b8,(string *)psVar5);
    }
    psVar5 = stream_trait<char>::out_string((string *)local_b8);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    pcVar3 = stream_trait<char>::out_text(":\n\n");
    std::operator<<(poVar4,pcVar3);
    std::__cxx11::string::~string(local_b8);
    ops = extraout_RDX;
    if ((__range3._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
      ops = extraout_RDX_00;
    }
    details::get_switch_strings_abi_cxx11_
              ((switch_strings *)&__begin0_1,(details *)&local_98->second,ops);
    __end0_1 = std::
               map<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
               ::begin((map<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
                        *)&__begin0_1);
    sw = (pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>
          *)std::
            map<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
            ::end((map<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
                   *)&__begin0_1);
    while (bVar1 = std::operator!=(&__end0_1,(_Self *)&sw), bVar1) {
      op = (option *)
           std::
           _Rb_tree_iterator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>
           ::operator*(&__end0_1);
      poStack_118 = gsl::not_null::operator_cast_to_option_((not_null *)op);
      __range4._7_1_ = 1;
      __range4._6_1_ = 0;
      this_00 = &op->container_pos_;
      __end0_2 = small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
                 ::begin((small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
                          *)this_00);
      name = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
              *)small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
                ::end((small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
                       *)this_00);
      while (bVar1 = pointer_based_iterator<std::tuple<std::__cxx11::string,unsigned_long>const>::
                     operator!=((pointer_based_iterator<std::tuple<std::__cxx11::string,unsigned_long>const>
                                 *)&__end0_2,
                                (pointer_based_iterator<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                                 *)&name), bVar1) {
        local_140 = pointer_based_iterator<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                    ::operator*(&__end0_2);
        if ((__range4._7_1_ & 1) == 0) {
          std::operator<<(this->outs_,"\n");
        }
        poVar4 = std::operator<<(this->outs_,"  ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::left);
        __n = details::int_cast<unsigned_long,void>(local_58);
        description._4_4_ = std::setw(__n);
        poVar4 = std::operator<<(poVar4,description._4_4_);
        pbVar6 = std::get<std::__cxx11::string,std::__cxx11::string,unsigned_long>(local_140);
        psVar5 = stream_trait<char>::out_string(pbVar6);
        std::operator<<(poVar4,(string *)psVar5);
        __range4._7_1_ = 0;
        pbVar6 = std::get<std::__cxx11::string,std::__cxx11::string,unsigned_long>(local_140);
        sVar7 = utf::length(pbVar6);
        puVar8 = std::get<unsigned_long,std::__cxx11::string,unsigned_long>(local_140);
        if (sVar7 != *puVar8) {
          assert_failed("pstore::utf::length (std::get<std::string> (name)) == std::get<std::size_t> (name)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/command_line/help.hpp"
                        ,0xd6);
        }
        puVar8 = std::get<unsigned_long,std::__cxx11::string,unsigned_long>(local_140);
        __range4._6_1_ = 0x14 < *puVar8;
        pointer_based_iterator<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
        ::operator++(&__end0_2);
      }
      std::operator<<(this->outs_," - ");
      local_150 = option::description_abi_cxx11_(poStack_118);
      __range4._7_1_ = 1;
      word_wrapper::word_wrapper(&local_188,local_150,sVar2);
      word_wrapper::end(&local_1c0,local_150,sVar2);
      local_1e8 = (long)&__range4 + 7;
      lStack_1e0 = (long)&__range4 + 6;
      psStack_1d0 = &categories._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_1c8 = &description_width;
      __f.is_overlong = (bool *)lStack_1e0;
      __f.is_first = (bool *)local_1e8;
      __f.this = this;
      __f.new_line = (czstring *)psStack_1d0;
      __f.indent = local_1c8;
      local_1d8 = this;
      std::
      for_each<pstore::command_line::word_wrapper,pstore::command_line::help<std::ostream>::show()::_lambda(std::__cxx11::string_const&)_1_>
                (&local_210,&local_188,&local_1c0,__f);
      word_wrapper::~word_wrapper(&local_1c0);
      word_wrapper::~word_wrapper(&local_188);
      std::operator<<(this->outs_,"\n");
      std::
      _Rb_tree_iterator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>
      ::operator++(&__end0_1);
    }
    std::
    map<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
    ::~map((map<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
            *)&__begin0_1);
    std::
    _Rb_tree_const_iterator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>
    ::operator++(&__end0);
  } while( true );
}

Assistant:

void help<OutputStream>::show () {
            static constexpr char const separator[] = " - ";
            static constexpr auto const separator_len = array_elements (separator) - 1U;

            std::size_t const max_width = details::get_max_width ();
            auto const new_line = ostream_traits::out_text ("\n");

            outs_ << ostream_traits::out_text ("OVERVIEW: ")
                  << ostream_traits::out_string (overview_) << new_line;
            usage ();

            auto const categories = details::build_categories (this, option::all ());
            std::size_t const max_name_len = widest_option (categories);

            auto const indent = max_name_len + separator_len;
            auto const description_width =
                max_width - max_name_len - separator_len - details::prefix_indent_len;

            for (auto const & cat : categories) {
                outs_ << new_line
                      << ostream_traits::out_string (cat.first == nullptr ? "OPTIONS"
                                                                          : cat.first->title ())
                      << ostream_traits::out_text (":\n\n");

                for (auto const & sw : details::get_switch_strings (cat.second)) {
                    option const * const op = sw.first;
                    auto is_first = true;
                    auto is_overlong = false;
                    for (std::tuple<std::string, std::size_t> const & name : sw.second) {
                        if (!is_first) {
                            outs_ << new_line;
                        }
                        outs_ << details::prefix_indent << std::left
                              << std::setw (details::int_cast (max_name_len))
                              << ostream_traits::out_string (std::get<std::string> (name));

                        is_first = false;
                        PSTORE_ASSERT (pstore::utf::length (std::get<std::string> (name)) ==
                                       std::get<std::size_t> (name));
                        is_overlong = std::get<std::size_t> (name) > details::overlong_opt_max;
                    }
                    outs_ << separator;

                    std::string const & description = op->description ();
                    is_first = true;
                    std::for_each (word_wrapper (description, description_width),
                                   word_wrapper::end (description, description_width),
                                   [&] (std::string const & str) {
                                       if (!is_first || is_overlong) {
                                           outs_ << new_line
                                                 << std::setw (details::int_cast (
                                                        indent + details::prefix_indent_len))
                                                 << ' ';
                                       }
                                       outs_ << ostream_traits::out_string (str);
                                       is_first = false;
                                       is_overlong = false;
                                   });
                    outs_ << new_line;
                }
            }
        }